

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

string * __thiscall CRPCTable::help(CRPCTable *this,string *strCommand,JSONRPCRequest *helpreq)

{
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
  __first;
  bool bVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar3;
  exception *e;
  CRPCCommand *pcmd;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>
  *command;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  *__range1_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>
  *entry;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  *__range1;
  string *strRet;
  iterator __end1_1;
  iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  vCommands;
  string strHelp;
  UniValue unused_result;
  string strMethod;
  JSONRPCRequest jreq;
  set<long,_std::less<long>,_std::allocator<long>_> setDone;
  string category;
  JSONRPCRequest *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  JSONRPCRequest *in_stack_fffffffffffffaf8;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
  in_stack_fffffffffffffb00;
  undefined7 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  _Rb_tree_const_iterator<long> in_stack_fffffffffffffb28;
  undefined6 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb36;
  undefined1 in_stack_fffffffffffffb37;
  JSONRPCRequest *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  JSONRPCRequest local_3e8 [2];
  undefined4 local_f8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::__cxx11::string::string(&(in_stack_fffffffffffffb00._M_current)->first);
  std::__cxx11::string::string(&(in_stack_fffffffffffffb00._M_current)->first);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffae8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
            *)in_stack_fffffffffffffae8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
          *)in_stack_fffffffffffffae8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
             *)in_stack_fffffffffffffb28._M_node,
            CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
           *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>_>
         *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffaf8,
                                 (_Self *)CONCAT17(in_stack_fffffffffffffaf7,
                                                   in_stack_fffffffffffffaf0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                 *)in_stack_fffffffffffffae8);
    std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::front
              ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20),
                   in_stack_fffffffffffffb18);
    std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>::front
              ((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    std::
    vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>
    ::emplace_back<std::__cxx11::string,CRPCCommand_const*const&>
              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
                *)CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08),
               &(in_stack_fffffffffffffb00._M_current)->first,
               (CRPCCommand **)in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_>_>_>
                  *)in_stack_fffffffffffffae8);
  }
  this_00 = local_3e8;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
         *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  __first._M_current._7_1_ = in_stack_fffffffffffffb0f;
  __first._M_current._0_7_ = in_stack_fffffffffffffb08;
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,CRPCCommand_const*>*,std::vector<std::pair<std::__cxx11::string,CRPCCommand_const*>,std::allocator<std::pair<std::__cxx11::string,CRPCCommand_const*>>>>>
            (__first,in_stack_fffffffffffffb00);
  JSONRPCRequest::JSONRPCRequest
            (this_00,(JSONRPCRequest *)
                     CONCAT17(in_stack_fffffffffffffb37,
                              CONCAT16(in_stack_fffffffffffffb36,in_stack_fffffffffffffb30)));
  local_f8 = 1;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffae8);
  UniValue::operator=((UniValue *)in_stack_fffffffffffffaf8,
                      (UniValue *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  UniValue::~UniValue((UniValue *)in_stack_fffffffffffffae8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
           *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
         *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
                           ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
                             *)in_stack_fffffffffffffaf8,
                            (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
    ::operator*((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
                 *)in_stack_fffffffffffffae8);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb37,
                        CONCAT16(in_stack_fffffffffffffb36,in_stack_fffffffffffffb30)),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb28._M_node);
    in_stack_fffffffffffffb37 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffaf8,
                         (char *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    if (((((in_stack_fffffffffffffb37 ^ 0xff) & 1) == 0) &&
        (in_stack_fffffffffffffb36 =
              std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaf8,
                              (char *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0))
        , !(bool)in_stack_fffffffffffffb36)) ||
       (_Var2 = std::operator==(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10),
       ((_Var2 ^ 0xffU) & 1) == 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      UniValue::UniValue((UniValue *)in_stack_fffffffffffffae8);
      pVar3 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)
                         in_stack_fffffffffffffaf8,
                         (value_type_conflict3 *)
                         CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
      in_stack_fffffffffffffb28 = pVar3.first._M_node;
      local_3e8[0].id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._32_1_ = pVar3.second;
      local_3e8[0].id.super__Optional_base<UniValue,_false,_false>._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_payload._24_8_ = in_stack_fffffffffffffb28._M_node;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)>::operator()
                  ((function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *)
                   in_stack_fffffffffffffb00._M_current,in_stack_fffffffffffffaf8,
                   (UniValue *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                   (bool)in_stack_fffffffffffffb0f);
      }
      UniValue::~UniValue((UniValue *)in_stack_fffffffffffffae8);
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
    ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>_>
                  *)in_stack_fffffffffffffae8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffaf8,
                          (char *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
  if (bVar1) {
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,in_RDI);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffae8);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffae8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffb10,CONCAT17(in_stack_fffffffffffffb0f,in_stack_fffffffffffffb08)
             ,(size_type)in_stack_fffffffffffffb00._M_current);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_01,in_RDI);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffae8);
  JSONRPCRequest::~JSONRPCRequest(in_stack_fffffffffffffae8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CRPCCommand_*>_>_>
             *)in_stack_fffffffffffffaf8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffae8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffae8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

std::string CRPCTable::help(const std::string& strCommand, const JSONRPCRequest& helpreq) const
{
    std::string strRet;
    std::string category;
    std::set<intptr_t> setDone;
    std::vector<std::pair<std::string, const CRPCCommand*> > vCommands;
    vCommands.reserve(mapCommands.size());

    for (const auto& entry : mapCommands)
        vCommands.emplace_back(entry.second.front()->category + entry.first, entry.second.front());
    sort(vCommands.begin(), vCommands.end());

    JSONRPCRequest jreq = helpreq;
    jreq.mode = JSONRPCRequest::GET_HELP;
    jreq.params = UniValue();

    for (const std::pair<std::string, const CRPCCommand*>& command : vCommands)
    {
        const CRPCCommand *pcmd = command.second;
        std::string strMethod = pcmd->name;
        if ((strCommand != "" || pcmd->category == "hidden") && strMethod != strCommand)
            continue;
        jreq.strMethod = strMethod;
        try
        {
            UniValue unused_result;
            if (setDone.insert(pcmd->unique_id).second)
                pcmd->actor(jreq, unused_result, /*last_handler=*/true);
        }
        catch (const std::exception& e)
        {
            // Help text is returned in an exception
            std::string strHelp = std::string(e.what());
            if (strCommand == "")
            {
                if (strHelp.find('\n') != std::string::npos)
                    strHelp = strHelp.substr(0, strHelp.find('\n'));

                if (category != pcmd->category)
                {
                    if (!category.empty())
                        strRet += "\n";
                    category = pcmd->category;
                    strRet += "== " + Capitalize(category) + " ==\n";
                }
            }
            strRet += strHelp + "\n";
        }
    }
    if (strRet == "")
        strRet = strprintf("help: unknown command: %s\n", strCommand);
    strRet = strRet.substr(0,strRet.size()-1);
    return strRet;
}